

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

int Gia_IsoSort(Gia_IsoMan_t *p)

{
  uint uVar1;
  Vec_Int_t *p_00;
  bool bVar2;
  int iVar3;
  uint nSize;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  abctime aVar6;
  abctime aVar7;
  ulong uVar8;
  int iVar9;
  uint i;
  int iVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  long local_40;
  
  p->nSingles = 0;
  p->vClasses2->nSize = 0;
  i = 0;
  iVar9 = 0;
  while( true ) {
    p_00 = p->vClasses;
    if (p_00->nSize <= (int)(i | 1)) {
      p->vClasses = p->vClasses2;
      p->vClasses2 = p_00;
      p->nEntries = p->nEntries - p->nSingles;
      return iVar9;
    }
    iVar3 = Vec_IntEntry(p_00,i);
    nSize = Vec_IntEntry(p->vClasses,i | 1);
    if ((int)nSize < 2) break;
    local_40 = (long)iVar3;
    pGVar4 = Gia_ManObj(p->pGia,*(int *)((long)p->pStoreW + local_40 * 8 + 4));
    uVar11 = (ulong)nSize;
    bVar2 = true;
    uVar8 = uVar11;
    lVar12 = local_40;
    while (bVar13 = uVar8 != 0, uVar8 = uVar8 - 1, bVar13) {
      pGVar5 = Gia_ManObj(p->pGia,*(int *)((long)p->pStoreW + lVar12 * 8 + 4));
      uVar1 = pGVar5->Value;
      *(uint *)(p->pStoreW + lVar12) = uVar1;
      if (uVar1 != pGVar4->Value) {
        bVar2 = false;
      }
      lVar12 = lVar12 + 1;
    }
    if (bVar2) {
      Vec_IntPush(p->vClasses2,iVar3);
      Vec_IntPush(p->vClasses2,nSize);
    }
    else {
      aVar6 = Abc_Clock();
      Abc_QuickSort3(p->pStoreW + local_40,nSize,0);
      aVar7 = Abc_Clock();
      p->timeSort = p->timeSort + (aVar7 - aVar6);
      pGVar4 = Gia_ManObj(p->pGia,*(int *)((long)p->pStoreW + local_40 * 8 + 4));
      iVar9 = iVar3;
      while( true ) {
        uVar11 = uVar11 - 1;
        local_40 = local_40 + 1;
        if (uVar11 == 0) break;
        pGVar5 = Gia_ManObj(p->pGia,*(int *)((long)p->pStoreW + local_40 * 8 + 4));
        if (pGVar4->Value != pGVar5->Value) {
          iVar10 = (int)local_40;
          pGVar4 = pGVar5;
          if (iVar10 - iVar9 == 1) {
            uVar8 = p->pStoreW[iVar9] >> 0x20;
            if (p->pUniques[uVar8] != 0) {
              __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                            ,0x157,"int Gia_IsoSort(Gia_IsoMan_t *)");
            }
            iVar9 = p->nUniques;
            p->nUniques = iVar9 + 1;
            p->pUniques[uVar8] = iVar9;
            p->nSingles = p->nSingles + 1;
            iVar9 = iVar10;
          }
          else {
            Vec_IntPush(p->vClasses2,iVar9);
            Vec_IntPush(p->vClasses2,iVar10 - iVar9);
            iVar9 = iVar10;
          }
        }
      }
      iVar3 = (nSize + iVar3) - iVar9;
      if (iVar3 == 1) {
        uVar8 = p->pStoreW[iVar9] >> 0x20;
        if (p->pUniques[uVar8] != 0) {
          __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                        ,0x167,"int Gia_IsoSort(Gia_IsoMan_t *)");
        }
        iVar9 = p->nUniques;
        p->nUniques = iVar9 + 1;
        p->pUniques[uVar8] = iVar9;
        p->nSingles = p->nSingles + 1;
      }
      else {
        Vec_IntPush(p->vClasses2,iVar9);
        Vec_IntPush(p->vClasses2,iVar3);
      }
      iVar9 = 1;
    }
    i = i + 2;
  }
  __assert_fail("nSize > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                ,0x137,"int Gia_IsoSort(Gia_IsoMan_t *)");
}

Assistant:

int Gia_IsoSort( Gia_IsoMan_t * p )
{
    Gia_Obj_t * pObj, * pObj0;
    int i, k, fSameValue, iBegin, iBeginOld, nSize, nSizeNew;
    int fRefined = 0;
    abctime clk;

    // go through the equiv classes
    p->nSingles = 0;
    Vec_IntClear( p->vClasses2 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        assert( nSize > 1 );
        fSameValue = 1;
        pObj0 = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin) );
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            Gia_IsoSetValue( p, iBegin+k, pObj->Value );
            if ( pObj->Value != pObj0->Value )
                fSameValue = 0;
        }
        if ( fSameValue )
        {
            Vec_IntPush( p->vClasses2, iBegin );
            Vec_IntPush( p->vClasses2, nSize );
            continue;
        }
        fRefined = 1;
        // sort objects
        clk = Abc_Clock();
        Abc_QuickSort3( p->pStoreW + iBegin, nSize, 0 );
        p->timeSort += Abc_Clock() - clk;
        // divide into new classes
        iBeginOld = iBegin;
        pObj0 = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin) );
        for ( k = 1; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            if ( pObj0->Value == pObj->Value )
                continue;
            nSizeNew = iBegin + k - iBeginOld;
            if ( nSizeNew == 1 )
            {
                assert( p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0 );
                p->pUniques[Gia_IsoGetItem(p, iBeginOld)] = p->nUniques++;
                p->nSingles++;
            }
            else
            {
                Vec_IntPush( p->vClasses2, iBeginOld );
                Vec_IntPush( p->vClasses2, nSizeNew );
            }
            iBeginOld = iBegin + k;
            pObj0 = pObj;
        }
        // add the last one
        nSizeNew = iBegin + k - iBeginOld;
        if ( nSizeNew == 1 )
        {
            assert( p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0 );
            p->pUniques[Gia_IsoGetItem(p, iBeginOld)] = p->nUniques++;
            p->nSingles++;
        }
        else
        {
            Vec_IntPush( p->vClasses2, iBeginOld );
            Vec_IntPush( p->vClasses2, nSizeNew );
        }
    }

    ABC_SWAP( Vec_Int_t *, p->vClasses, p->vClasses2 );
    p->nEntries -= p->nSingles;
    return fRefined;
}